

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O2

int __thiscall DIS::StopFreezeReliablePdu::getMarshalledSize(StopFreezeReliablePdu *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar2 = ClockTime::getMarshalledSize(&this->_realWorldTime);
  return iVar2 + iVar1 + 8;
}

Assistant:

int StopFreezeReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _realWorldTime.getMarshalledSize();  // _realWorldTime
   marshalSize = marshalSize + 1;  // _reason
   marshalSize = marshalSize + 1;  // _frozenBehavior
   marshalSize = marshalSize + 1;  // _requiredReliablityService
   marshalSize = marshalSize + 1;  // _pad1
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}